

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

string * __thiscall
Parse::toSymTypeName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Type *type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*type) {
  case INT:
    pcVar2 = "int";
    paVar1 = &local_9;
    break;
  case DOUBLE:
    pcVar2 = "double";
    paVar1 = &local_c;
    break;
  case CHAR:
    pcVar2 = "char";
    paVar1 = &local_b;
    break;
  case BOOL:
    pcVar2 = "bool";
    paVar1 = &local_a;
    break;
  case ARRAY:
    pcVar2 = "arr";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string Parse::toSymTypeName(Type &type) {

    if(type == Type::INT) {
        return "int";
    } else if(type == Type::BOOL) {
        return "bool";
    } else if(type == Type::CHAR) {
        return "char";
    } else if(type == Type::DOUBLE) {
        return "double";
    } else if(type == Type::ARRAY) {
        return "arr";
    }
    return "";
}